

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  byte local_49;
  string local_48 [7];
  bool all_idx;
  string parquetOutFile;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool parquet_output;
  bool ord_output;
  bool remove_zero_exposure_records;
  bool show_exposure_value;
  bool fullprecision;
  bool skipheader;
  int opt;
  char **argv_local;
  int argc_local;
  
  local_1d = false;
  local_1e = false;
  local_1f = false;
  local_20 = false;
  local_21 = false;
  bVar1 = false;
  std::__cxx11::string::string(local_48);
  local_49 = 0;
  while (iVar3 = getopt(argc,argv,"zvhfseoap:"), iVar3 != -1) {
    switch(iVar3) {
    case 0x61:
      local_49 = 1;
      break;
    case 0x65:
      local_1f = true;
      break;
    case 0x66:
      local_1e = true;
      break;
    case 0x68:
      help();
      exit(1);
    case 0x6f:
      local_21 = true;
      break;
    case 0x70:
      bVar1 = true;
      std::__cxx11::string::operator=(local_48,_optarg);
      break;
    case 0x73:
      local_1d = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    case 0x7a:
      local_20 = true;
    }
  }
  if (bVar1) {
    fprintf(_stderr,
            "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
           );
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  initstreams((string *)local_80,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar2 = local_49;
  std::__cxx11::string::string(local_d0,local_48);
  doit(local_1d,local_1e,local_1f,local_20,local_21,(bool)(bVar2 & 1),false,(string *)local_d0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_48);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	bool skipheader = false;
	bool fullprecision = false;
	bool show_exposure_value = false;
	bool remove_zero_exposure_records = false;
	bool ord_output = false;   // csv output
	bool parquet_output = false;   // parquet output
	std::string parquetOutFile;   // parquet output
	bool all_idx = false;
	while ((opt = getopt(argc, argv, "zvhfseoap:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'f':
			fullprecision = true;
			break;
		case 'e':
			show_exposure_value = true;
			break;
		case 'z':
			remove_zero_exposure_records = true;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquetOutFile = optarg;
			break;
		case 'a':
			all_idx = true;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

	initstreams();
	doit(skipheader, fullprecision, show_exposure_value,
	     remove_zero_exposure_records, ord_output, all_idx, parquet_output,
	     parquetOutFile);
	return EXIT_SUCCESS;
}